

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap2.c
# Opt level: O2

void ftgcvs_(int *A1,int *A2,int *A3,int *A4,int *A5,char *A6,char *A7,int *A8,int *A9,size_t C6,
            size_t C7)

{
  int colnum;
  int iVar1;
  int iVar2;
  uint uVar3;
  fitsfile *fptr;
  void *pvVar4;
  char **B;
  char *pcVar5;
  int nelem;
  ulong uVar6;
  size_t sVar7;
  int felem_len;
  int iVar8;
  char *local_70;
  char *local_68;
  unsigned_long gMinStrLen;
  int type;
  long repeat;
  
  gMinStrLen = 0x50;
  fptr = gFitsFiles[*A1];
  colnum = *A2;
  iVar1 = *A3;
  iVar2 = *A4;
  uVar3 = *A5;
  if ((((C6 < 4) || (*A6 != '\0')) || (A6[1] != '\0')) || ((A6[2] != '\0' || (A6[3] != '\0')))) {
    pvVar4 = memchr(A6,0,C6);
    if (pvVar4 == (void *)0x0) {
      sVar7 = 0x50;
      if (0x50 < C6) {
        sVar7 = C6;
      }
      local_70 = (char *)malloc(sVar7 + 1);
      local_70[C6] = '\0';
      memcpy(local_70,A6,C6);
      kill_trailing(local_70,(char)A6);
      local_68 = local_70;
    }
    else {
      local_68 = (char *)0x0;
      local_70 = A6;
    }
  }
  else {
    local_68 = (char *)0x0;
    local_70 = (char *)0x0;
  }
  ffgtcl(fptr,colnum,&type,&repeat,(long *)&gMinStrLen,A9);
  uVar6 = 1;
  if (1 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  if (type < 0) {
    uVar6 = 1;
  }
  felem_len = (int)C7;
  iVar8 = felem_len;
  if (C7 < gMinStrLen) {
    iVar8 = (int)gMinStrLen;
  }
  iVar8 = iVar8 + 1;
  B = (char **)malloc(uVar6 * 8);
  nelem = (int)uVar6;
  pcVar5 = (char *)malloc((ulong)(uint)(iVar8 * nelem));
  *B = pcVar5;
  pcVar5 = f2cstrv2(A7,pcVar5,felem_len,iVar8,nelem);
  vindex(B,iVar8,nelem,pcVar5);
  ffgcvs(fptr,colnum,(long)iVar1,(long)iVar2,(long)(int)uVar3,local_70,B,A8,A9);
  free(local_68);
  c2fstrv2(*B,A7,iVar8,felem_len,nelem);
  free(*B);
  free(B);
  *A8 = (uint)(*A8 != 0);
  return;
}

Assistant:

CFextern VOID_cfF(FTGCVS,ftgcvs)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,INT,LONG,LONG,LONG,STRING,PSTRINGV,PLOGICAL,PINT,CF_0,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(INT,2)
   QCF(LONG,3)
   QCF(LONG,4)
   QCF(LONG,5)
   QCF(STRING,6)
   QCF(PSTRINGV,7)
   QCF(PLOGICAL,8)
   QCF(PINT,9)

   fitsfile *fptr;
   int colnum, *anynul, *status, velem, type;
   long firstrow, firstelem, nelem;
   long repeat;
   unsigned long gMinStrLen=80L;  /* gMin = width */
   char *nulval, **array;

   fptr =      TCF(ftgcvs,FITSUNIT,1,0);
   colnum =    TCF(ftgcvs,INT,2,0);
   firstrow =  TCF(ftgcvs,LONG,3,0);
   firstelem = TCF(ftgcvs,LONG,4,0);
   nelem =     TCF(ftgcvs,LONG,5,0);
   nulval =    TCF(ftgcvs,STRING,6,0);
   /*  put off variable 7 (array) until column type is learned  */
   anynul =    TCF(ftgcvs,PLOGICAL,8,0);
   status =    TCF(ftgcvs,PINT,9,0);
   
   ffgtcl( fptr, colnum, &type, &repeat, (long *)&gMinStrLen, status );
   if( type<0 ) velem = 1;   /*  Variable length column  */
   else velem = nelem;

   array = TCF(ftgcvs,PSTRINGV,7,0);

   ffgcvs( fptr, colnum, firstrow, firstelem, nelem, nulval, array,
           anynul, status );

   RCF(FITSUNIT,1)
   RCF(INT,2)
   RCF(LONG,3)
   RCF(LONG,4)
   RCF(LONG,5)
   RCF(STRING,6)
   RCF(PSTRINGV,7)
   RCF(PLOGICAL,8)
   RCF(PINT,9)
}